

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::getUsedRegs
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,shared_ptr<mocker::nasm::Inst> *inst)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  pointer psVar6;
  int iVar7;
  shared_ptr<mocker::nasm::Register> *psVar8;
  long lVar9;
  long lVar10;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *this;
  bool bVar11;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_00;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_01;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_02;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_03;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_04;
  shared_ptr<mocker::nasm::Call> p;
  shared_ptr<mocker::nasm::BinaryInst> p_4;
  shared_ptr<mocker::nasm::Lea> p_2;
  shared_ptr<mocker::nasm::Mov> p_1;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_140;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *local_128;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_120;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  long local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  shared_ptr<mocker::nasm::Addr> local_90;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_128 = __return_storage_ptr__;
  dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_108,inst);
  psVar6 = local_108.
           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar11 = true;
  if ((element_type *)
      local_108.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (element_type *)0x0) {
    dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_40,inst);
    if (local_40 == 0) {
      dyc<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_50,inst);
      if (local_50 == 0) {
        dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_60,inst);
        if (local_60 == 0) {
          dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_70,inst)
          ;
          if (local_70 == 0) {
            dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_80,inst)
            ;
            bVar11 = local_80 != 0;
            bVar2 = true;
            bVar3 = true;
            bVar4 = true;
            bVar5 = true;
            goto LAB_001a4e31;
          }
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
        bVar4 = true;
      }
      else {
        bVar3 = false;
        bVar4 = false;
      }
      bVar2 = false;
      bVar5 = true;
      bVar11 = true;
      goto LAB_001a4e31;
    }
  }
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
LAB_001a4e31:
  if ((bVar2) && (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if ((bVar3) && (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((bVar4) && (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if ((bVar5) && (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (((element_type *)psVar6 == (element_type *)0x0) &&
     (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_108.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_108.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (bVar11) {
    (local_128->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_128->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_128->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = local_128;
  }
  else {
    dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_140,inst);
    this = local_128;
    psVar6 = local_140.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((element_type *)
        local_140.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
      if (rdi()::res == '\0') {
        iVar7 = __cxa_guard_acquire(&rdi()::res);
        if (iVar7 != 0) {
          rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&rdi::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&rdi::res,
                     (allocator<mocker::nasm::Register> *)&local_120,(char (*) [4])"rdi");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&rdi::res,&__dso_handle);
          __cxa_guard_release(&rdi()::res);
          this = local_128;
        }
      }
      local_108.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      local_108.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (rsi()::res == '\0') {
        iVar7 = __cxa_guard_acquire(&rsi()::res);
        if (iVar7 != 0) {
          rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&rsi::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&rsi::res,
                     (allocator<mocker::nasm::Register> *)&local_120,(char (*) [4])"rsi");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&rsi::res,&__dso_handle);
          __cxa_guard_release(&rsi()::res);
          this = local_128;
        }
      }
      local_108.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      local_f0 = rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (rdx()::res == '\0') {
        iVar7 = __cxa_guard_acquire(&rdx()::res);
        if (iVar7 != 0) {
          rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&rdx::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&rdx::res,
                     (allocator<mocker::nasm::Register> *)&local_120,(char (*) [4])"rdx");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&rdx::res,&__dso_handle);
          __cxa_guard_release(&rdx()::res);
          this = local_128;
        }
      }
      local_e8 = rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_e0 = rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (rcx()::res == '\0') {
        iVar7 = __cxa_guard_acquire(&rcx()::res);
        if (iVar7 != 0) {
          rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&rcx::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&rcx::res,
                     (allocator<mocker::nasm::Register> *)&local_120,(char (*) [4])"rcx");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&rcx::res,&__dso_handle);
          __cxa_guard_release(&rcx()::res);
          this = local_128;
        }
      }
      local_d8 = rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_d0 = rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (r8()::res == '\0') {
        iVar7 = __cxa_guard_acquire(&r8()::res);
        if (iVar7 != 0) {
          r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[3]>
                    (&r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(Register **)&r8::res,
                     (allocator<mocker::nasm::Register> *)&local_120,(char (*) [3])"r8");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&r8::res,&__dso_handle);
          __cxa_guard_release(&r8()::res);
          this = local_128;
        }
      }
      local_c8 = r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_c0 = r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (r9()::res == '\0') {
        iVar7 = __cxa_guard_acquire(&r9()::res);
        if (iVar7 != 0) {
          r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[3]>
                    (&r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(Register **)&r9::res,
                     (allocator<mocker::nasm::Register> *)&local_120,(char (*) [3])"r9");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&r9::res,&__dso_handle);
          __cxa_guard_release(&r9()::res);
          this = local_128;
        }
      }
      local_b8 = r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_b0 = r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      __l._M_len = 6;
      __l._M_array = (iterator)&local_108;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::vector(this,__l,(allocator_type *)&local_120);
      lVar9 = 0x60;
      do {
        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_120.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar9);
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        lVar9 = lVar9 + -0x10;
      } while (lVar9 != 0);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_140.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_140.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((element_type *)psVar6 == (element_type *)0x0) {
      dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_a0,inst);
      lVar9 = local_a0;
      if (local_a0 != 0) {
        local_108.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_a0 + 0x18);
        local_108.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(local_a0 + 0x20);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_108.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_108.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_108.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_108.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_108.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          }
        }
        getInvolvedRegs(this,(shared_ptr<mocker::nasm::Addr> *)&local_108);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_108.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_108.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        local_140.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_a0 + 8);
        local_140.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(local_a0 + 0x10);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_140.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_140.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_140.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_140.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_140.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          }
        }
        dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                  ((nasm *)&local_108,(shared_ptr<mocker::nasm::Addr> *)&local_140);
        psVar6 = local_108.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_108.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_108.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_140.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_140.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((element_type *)psVar6 == (element_type *)0x0) {
          local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(local_a0 + 8);
          local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_a0 + 0x10);
          if (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          getInvolvedRegs(&local_120,&local_90);
          anon_unknown_52::merge(&local_140,this,&local_120);
          local_108.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (this->
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_108.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (this->
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_108.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (this->
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
          (this->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_start =
               local_140.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (this->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_finish =
               local_140.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (this->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_140.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_140.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_140.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_140.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector(&local_108);
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector(&local_140);
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector(&local_120);
          if (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
      }
      if (lVar9 == 0) {
        dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_108,inst);
        psVar6 = local_108.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((element_type *)
            local_108.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
          getInvolvedRegs(this,(shared_ptr<mocker::nasm::Addr> *)
                               &((string *)
                                ((long)local_108.
                                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 8))->field_2);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_108.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_108.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((element_type *)psVar6 == (element_type *)0x0) {
          dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((nasm *)&local_108,inst);
          psVar6 = local_108.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((element_type *)
              local_108.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
            local_140.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((string *)
                          ((long)local_108.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 8))->_M_string_length;
            local_140.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(((string *)
                           ((long)local_108.
                                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))->field_2).
                          _M_allocated_capacity;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_140.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_140.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_140.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_140.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_140.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
              }
            }
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&local_140;
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::vector(this,__l_00,(allocator_type *)&local_120);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_140.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_140.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_108.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_108.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if ((element_type *)psVar6 == (element_type *)0x0) {
            dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((nasm *)&local_120,inst);
            psVar6 = local_120.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_120.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              getInvolvedRegs(&local_108,
                              (shared_ptr<mocker::nasm::Addr> *)
                              (local_120.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1));
              getInvolvedRegs(&local_140,
                              (shared_ptr<mocker::nasm::Addr> *)
                              (local_120.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2));
              anon_unknown_52::merge(this,&local_108,&local_140);
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::~vector(&local_140);
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::~vector(&local_108);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_120.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_120.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (psVar6 == (pointer)0x0) {
              dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((nasm *)&local_108,inst);
              psVar6 = local_108.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((element_type *)
                  local_108.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
                local_140.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(((string *)
                               ((long)local_108.
                                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8))->_M_dataplus).
                              _M_p;
                local_140.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((string *)
                              ((long)local_108.
                                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 8))->
                              _M_string_length;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_140.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_140.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_140.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_140.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_140.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                  }
                }
                __l_01._M_len = 1;
                __l_01._M_array = (iterator)&local_140;
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::vector(this,__l_01,(allocator_type *)&local_120);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_140.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_140.
                             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_108.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_108.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              if ((element_type *)psVar6 == (element_type *)0x0) {
                dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((nasm *)&local_108,inst);
                psVar6 = local_108.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((element_type *)
                    local_108.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
                  psVar8 = rbp();
                  local_140.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)(psVar8->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr;
                  local_140.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)(psVar8->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                )._M_refcount._M_pi;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_140.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_140.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_140.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_140.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_140.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                    }
                  }
                  __l_02._M_len = 1;
                  __l_02._M_array = (iterator)&local_140;
                  std::
                  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ::vector(this,__l_02,(allocator_type *)&local_120);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_140.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_140.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_108.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_108.
                             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                if ((element_type *)psVar6 == (element_type *)0x0) {
                  dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                            ((nasm *)&local_120,inst);
                  psVar6 = local_120.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (local_120.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    getInvolvedRegs(&local_108,
                                    (shared_ptr<mocker::nasm::Addr> *)
                                    &((local_120.
                                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount);
                    getInvolvedRegs(&local_140,
                                    (shared_ptr<mocker::nasm::Addr> *)
                                    &local_120.
                                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].
                                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
                    anon_unknown_52::merge(this,&local_108,&local_140);
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::~vector(&local_140);
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::~vector(&local_108);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_120.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_120.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  if (psVar6 == (pointer)0x0) {
                    dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                              ((nasm *)&local_a0,inst);
                    lVar9 = local_a0;
                    if (local_a0 != 0) {
                      psVar8 = rax();
                      local_108.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)(psVar8->
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr;
                      local_108.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)(psVar8->
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_refcount._M_pi;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_108.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_108.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_108.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_108.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_108.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                        }
                      }
                      psVar8 = rdx();
                      local_108.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)(psVar8->
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr;
                      local_f0 = (psVar8->
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_refcount._M_pi;
                      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          local_f0->_M_use_count = local_f0->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          local_f0->_M_use_count = local_f0->_M_use_count + 1;
                        }
                      }
                      __l_03._M_len = 2;
                      __l_03._M_array = (iterator)&local_108;
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::vector(&local_140,__l_03,(allocator_type *)&local_90);
                      getInvolvedRegs(&local_120,(shared_ptr<mocker::nasm::Addr> *)(local_a0 + 8));
                      anon_unknown_52::merge(this,&local_140,&local_120);
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::~vector(&local_120);
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::~vector(&local_140);
                      lVar10 = 0x20;
                      do {
                        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                  ((long)&local_120.
                                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                  lVar10);
                        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                        }
                        lVar10 = lVar10 + -0x10;
                      } while (lVar10 != 0);
                    }
                    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
                    }
                    if (lVar9 == 0) {
                      dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>
                                ((nasm *)&local_140,inst);
                      psVar6 = local_140.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if ((element_type *)
                          local_140.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
                        psVar8 = rbp();
                        local_108.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)(psVar8->
                                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr;
                        local_108.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             (pointer)(psVar8->
                                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_refcount._M_pi;
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            local_108.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            local_108.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_108.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            local_108.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_108.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                          }
                        }
                        psVar8 = rbx();
                        local_108.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)(psVar8->
                                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr;
                        local_f0 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_f0->_M_use_count = local_f0->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_f0->_M_use_count = local_f0->_M_use_count + 1;
                          }
                        }
                        psVar8 = r12();
                        local_e8 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                        local_e0 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_e0->_M_use_count = local_e0->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_e0->_M_use_count = local_e0->_M_use_count + 1;
                          }
                        }
                        psVar8 = r13();
                        local_d8 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                        local_d0 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_d0->_M_use_count = local_d0->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_d0->_M_use_count = local_d0->_M_use_count + 1;
                          }
                        }
                        psVar8 = r14();
                        local_c8 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                        local_c0 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_c0->_M_use_count = local_c0->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_c0->_M_use_count = local_c0->_M_use_count + 1;
                          }
                        }
                        psVar8 = r15();
                        local_b8 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                        local_b0 = (psVar8->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_b0->_M_use_count = local_b0->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_b0->_M_use_count = local_b0->_M_use_count + 1;
                          }
                        }
                        __l_04._M_len = 6;
                        __l_04._M_array = (iterator)&local_108;
                        std::
                        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ::vector(local_128,__l_04,(allocator_type *)&local_120);
                        lVar9 = 0x60;
                        do {
                          p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                    ((long)&local_120.
                                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    lVar9);
                          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                          }
                          lVar9 = lVar9 + -0x10;
                        } while (lVar9 != 0);
                      }
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_140.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_140.
                                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
                      }
                      this = local_128;
                      if ((element_type *)psVar6 == (element_type *)0x0) {
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                      ,0x5a,
                                      "std::vector<std::shared_ptr<Register>> mocker::nasm::getUsedRegs(const std::shared_ptr<Inst> &)"
                                     );
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

std::vector<std::shared_ptr<Register>>
getUsedRegs(const std::shared_ptr<Inst> &inst) {
  if (dyc<Empty>(inst) || dyc<Pop>(inst) || dyc<Jmp>(inst) || dyc<Cqo>(inst) ||
      dyc<CJump>(inst) || dyc<Set>(inst))
    return {};

  if (auto p = dyc<Call>(inst)) {
    return {rdi(), rsi(), rdx(), rcx(), r8(), r9()};
  }

  if (auto p = dyc<Mov>(inst)) {
    auto res = getInvolvedRegs(p->getOperand());
    if (!dyc<Register>(p->getDest()))
      res = merge(res, getInvolvedRegs(p->getDest()));
    return res;
  }

  if (auto p = dyc<Lea>(inst)) {
    return getInvolvedRegs(p->getAddr());
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return merge(getInvolvedRegs(p->getLhs()), getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<Push>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<Leave>(inst)) {
    return {rbp()};
  }
  if (auto p = dyc<Cmp>(inst)) {
    return merge(getInvolvedRegs(p->getLhs()), getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<IDiv>(inst)) {
    return merge({rax(), rdx()}, getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<Ret>(inst)) {
    return {rbp(), rbx(), r12(), r13(), r14(), r15()};
  }
  assert(false);
}